

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecUtil.c
# Opt level: O0

Vec_Int_t * Gia_PolynCollectLastXor(Gia_Man_t *pGia,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vXors_00;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vXors;
  int fVerbose_local;
  Gia_Man_t *pGia_local;
  
  vXors_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ManCoNum(pGia);
  pObj_00 = Gia_ManCo(pGia,iVar1 + -1);
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  Gia_ManIncrementTravId(pGia);
  iVar1 = Gia_ObjFaninId0p(pGia,pObj_00);
  Gia_PolynCollectXors_rec(pGia,iVar1,vXors_00);
  Vec_IntReverseOrder(vXors_00);
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return vXors_00;
}

Assistant:

Vec_Int_t * Gia_PolynCollectLastXor( Gia_Man_t * pGia, int fVerbose )
{
    Vec_Int_t * vXors = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj = Gia_ManCo( pGia, Gia_ManCoNum(pGia)-1 );
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManIncrementTravId( pGia );
    Gia_PolynCollectXors_rec( pGia, Gia_ObjFaninId0p(pGia, pObj), vXors );
    Vec_IntReverseOrder( vXors );
    ABC_FREE( pGia->pRefs );
    return vXors;
}